

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall
BackwardPass::DeadStoreOrChangeInstrForScopeObjRemoval(BackwardPass *this,Instr **pInstrPrev)

{
  OpCode OVar1;
  Func *func;
  Sym *sym_00;
  code *pcVar2;
  Instr *this_00;
  bool bVar3;
  ArgSlot formalsIndex;
  uint32 index;
  uint uVar4;
  SymOpnd *pSVar5;
  PropertySym *pPVar6;
  char16 *pcVar7;
  Opnd *pOVar8;
  HelperCallOpnd *pHVar9;
  StackSym *pSVar10;
  Instr *pIVar11;
  RegOpnd *pRVar12;
  undefined4 *puVar13;
  JITTimeFunctionBody *pJVar14;
  IntConstOpnd *pIVar15;
  uint nestedFuncIndex;
  Opnd *intConstOpnd;
  Instr *instrToDelete;
  Instr *nextInstr;
  Instr *instrDef;
  RegOpnd *scopeObjOpnd;
  RegOpnd *srcOpnd;
  StackSym *paramStackSym;
  ArgSlot value;
  PropertySym *propSym;
  Sym *sym;
  Opnd *src1;
  Func *currFunc;
  Instr *instr;
  Instr **pInstrPrev_local;
  BackwardPass *this_local;
  
  nextInstr = this->currentInstr;
  func = nextInstr->m_func;
  if (((this->tag == DeadStorePhase) && (bVar3 = Func::IsStackArgsEnabled(nextInstr->m_func), bVar3)
      ) && ((bVar3 = IsPrePass(this), bVar3 || (this->currentBlock->loop == (Loop *)0x0)))) {
    OVar1 = nextInstr->m_opcode;
    if (OVar1 == LdSlot) {
      pOVar8 = IR::Instr::GetSrc1(nextInstr);
      if ((pOVar8 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsSymOpnd(pOVar8), bVar3)) {
        pSVar5 = IR::Opnd::AsSymOpnd(pOVar8);
        sym_00 = pSVar5->m_sym;
        if (sym_00 == (Sym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1001,"(sym)","sym");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        bVar3 = IsFormalParamSym(this,func,sym_00);
        if (bVar3) {
          pJVar14 = Func::GetJITFunctionBody(func);
          bVar3 = JITTimeFunctionBody::HasImplicitArgIns(pJVar14);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1004,"(!currFunc->GetJITFunctionBody()->HasImplicitArgIns())",
                               "We don\'t have mappings between named formals and arguments object here"
                              );
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
          nextInstr->m_opcode = Ld_A;
          pPVar6 = Sym::AsPropertySym(sym_00);
          formalsIndex = (ArgSlot)pPVar6->m_propertyId;
          bVar3 = Func::HasStackSymForFormal(func,formalsIndex);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x100a,"(currFunc->HasStackSymForFormal(value))",
                               "currFunc->HasStackSymForFormal(value)");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
          pSVar10 = Func::GetStackSymForFormal(func,formalsIndex);
          pRVar12 = IR::RegOpnd::New(pSVar10,TyVar,func);
          IR::Opnd::SetIsJITOptimizedReg(&pRVar12->super_Opnd,true);
          IR::Instr::ReplaceSrc1(nextInstr,&pRVar12->super_Opnd);
          ProcessSymUse(this,&pSVar10->super_Sym,true,'\x01');
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,StackArgFormalsOptPhase);
          if ((bVar3) && ((DAT_01ec73ca & 1) != 0)) {
            pJVar14 = Func::GetJITFunctionBody(nextInstr->m_func);
            pcVar7 = JITTimeFunctionBody::GetDisplayName(pJVar14);
            uVar4 = Func::GetFunctionNumber(nextInstr->m_func);
            Output::Print(L"StackArgFormals : %s (%d) :Replacing LdSlot with Ld_A in Deadstore pass. \n"
                          ,pcVar7,(ulong)uVar4);
            Output::Flush();
          }
        }
      }
    }
    else if (OVar1 == GetCachedFunc) {
      pOVar8 = IR::Instr::GetSrc1(nextInstr);
      bVar3 = IR::Opnd::IsScopeObjOpnd(pOVar8,func);
      if (bVar3) {
        nextInstr->m_opcode = NewScFunc;
        pOVar8 = IR::Instr::UnlinkSrc2(nextInstr);
        bVar3 = IR::Opnd::IsIntConstOpnd(pOVar8);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1057,"(intConstOpnd->IsIntConstOpnd())",
                             "intConstOpnd->IsIntConstOpnd()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pJVar14 = Func::GetJITFunctionBody(nextInstr->m_func);
        pIVar15 = IR::Opnd::AsIntConstOpnd(pOVar8);
        index = IR::IntConstOpnd::AsUint32(pIVar15);
        uVar4 = JITTimeFunctionBody::GetNestedFuncIndexForSlotIdInCachedScope(pJVar14,index);
        IR::Opnd::Free(pOVar8,nextInstr->m_func);
        pIVar15 = IR::IntConstOpnd::New((ulong)uVar4,TyUint32,nextInstr->m_func,false);
        IR::Instr::ReplaceSrc1(nextInstr,&pIVar15->super_Opnd);
        pSVar10 = Func::GetLocalFrameDisplaySym(func);
        pRVar12 = IR::RegOpnd::New(pSVar10,TyVar,func);
        IR::Instr::SetSrc2(nextInstr,&pRVar12->super_Opnd);
      }
    }
    else if (OVar1 == CommitScope) {
      pOVar8 = IR::Instr::GetSrc1(nextInstr);
      bVar3 = IR::Opnd::IsScopeObjOpnd(pOVar8,func);
      if (bVar3) {
        IR::Instr::Remove(nextInstr);
        return true;
      }
    }
    else if (OVar1 == CallHelper) {
      pOVar8 = IR::Instr::GetSrc1(nextInstr);
      pHVar9 = IR::Opnd::AsHelperCallOpnd(pOVar8);
      if (pHVar9->m_fnHelper == HelperOP_InitCachedFuncs) {
        pOVar8 = IR::Instr::GetSrc2(nextInstr);
        pSVar10 = IR::Opnd::GetStackSym(pOVar8);
        pIVar11 = StackSym::GetInstrDef(pSVar10);
        pOVar8 = IR::Instr::GetSrc1(pIVar11);
        pRVar12 = IR::Opnd::AsRegOpnd(pOVar8);
        bVar3 = IR::Opnd::IsScopeObjOpnd(&pRVar12->super_Opnd,func);
        if (bVar3) {
          pIVar11 = nextInstr->m_next;
          while (this_00 = nextInstr, nextInstr != (Instr *)0x0) {
            pOVar8 = IR::Instr::GetSrc2(nextInstr);
            if (pOVar8 == (Opnd *)0x0) {
              nextInstr = (Instr *)0x0;
            }
            else {
              pOVar8 = IR::Instr::GetSrc2(nextInstr);
              pSVar10 = IR::Opnd::GetStackSym(pOVar8);
              nextInstr = StackSym::GetInstrDef(pSVar10);
              if (nextInstr->m_opcode != ArgOut_A) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar13 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x103e,"(instrDef->m_opcode == Js::OpCode::ArgOut_A)",
                                   "instrDef->m_opcode == Js::OpCode::ArgOut_A");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar13 = 0;
              }
            }
            IR::Instr::Remove(this_00);
          }
          if (pIVar11 == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1046,"(nextInstr != nullptr)","nextInstr != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
          *pInstrPrev = pIVar11->m_prev;
          return true;
        }
      }
    }
    else if ((ushort)(OVar1 - BrFncCachedScopeEq) < 2) {
      pOVar8 = IR::Instr::GetSrc2(nextInstr);
      bVar3 = IR::Opnd::IsScopeObjOpnd(pOVar8,func);
      if (bVar3) {
        IR::Instr::Remove(nextInstr);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::DeadStoreOrChangeInstrForScopeObjRemoval(IR::Instr ** pInstrPrev)
{
    IR::Instr * instr = this->currentInstr;
    Func * currFunc = instr->m_func;

    if (this->tag == Js::DeadStorePhase && instr->m_func->IsStackArgsEnabled() && (IsPrePass() || !currentBlock->loop))
    {
        switch (instr->m_opcode)
        {
            /*
            *   This LdSlot loads the formal from the formals array. We replace this a Ld_A <ArgInSym>.
            *   ArgInSym is inserted at the beginning of the function during the start of the deadstore pass- for the top func.
            *   In case of inlinee, it will be from the source sym of the ArgOut Instruction to the inlinee.
            */
            case Js::OpCode::LdSlot:
            {
                IR::Opnd * src1 = instr->GetSrc1();
                if (src1 && src1->IsSymOpnd())
                {
                    Sym * sym = src1->AsSymOpnd()->m_sym;
                    Assert(sym);
                    if (IsFormalParamSym(currFunc, sym))
                    {
                        AssertMsg(!currFunc->GetJITFunctionBody()->HasImplicitArgIns(), "We don't have mappings between named formals and arguments object here");

                        instr->m_opcode = Js::OpCode::Ld_A;
                        PropertySym * propSym = sym->AsPropertySym();
                        Js::ArgSlot    value = (Js::ArgSlot)propSym->m_propertyId;

                        Assert(currFunc->HasStackSymForFormal(value));
                        StackSym * paramStackSym = currFunc->GetStackSymForFormal(value);
                        IR::RegOpnd * srcOpnd = IR::RegOpnd::New(paramStackSym, TyVar, currFunc);
                        srcOpnd->SetIsJITOptimizedReg(true);
                        instr->ReplaceSrc1(srcOpnd);
                        this->ProcessSymUse(paramStackSym, true, true);

                        if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase))
                        {
                            Output::Print(_u("StackArgFormals : %s (%d) :Replacing LdSlot with Ld_A in Deadstore pass. \n"), instr->m_func->GetJITFunctionBody()->GetDisplayName(), instr->m_func->GetFunctionNumber());
                            Output::Flush();
                        }
                    }
                }
                break;
            }
            case Js::OpCode::CommitScope:
            {
                if (instr->GetSrc1()->IsScopeObjOpnd(currFunc))
                {
                    instr->Remove();
                    return true;
                }
                break;
            }
            case Js::OpCode::BrFncCachedScopeEq:
            case Js::OpCode::BrFncCachedScopeNeq:
            {
                if (instr->GetSrc2()->IsScopeObjOpnd(currFunc))
                {
                    instr->Remove();
                    return true;
                }
                break;
            }
            case Js::OpCode::CallHelper:
            {
                //Remove the CALL and all its Argout instrs.
                if (instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperOP_InitCachedFuncs)
                {
                    IR::RegOpnd * scopeObjOpnd = instr->GetSrc2()->GetStackSym()->GetInstrDef()->GetSrc1()->AsRegOpnd();
                    if (scopeObjOpnd->IsScopeObjOpnd(currFunc))
                    {
                        IR::Instr * instrDef = instr;
                        IR::Instr * nextInstr = instr->m_next;

                        while (instrDef != nullptr)
                        {
                            IR::Instr * instrToDelete = instrDef;
                            if (instrDef->GetSrc2() != nullptr)
                            {
                                instrDef = instrDef->GetSrc2()->GetStackSym()->GetInstrDef();
                                Assert(instrDef->m_opcode == Js::OpCode::ArgOut_A);
                            }
                            else
                            {
                                instrDef = nullptr;
                            }
                            instrToDelete->Remove();
                        }
                        Assert(nextInstr != nullptr);
                        *pInstrPrev = nextInstr->m_prev;
                        return true;
                    }
                }
                break;
            }
            case Js::OpCode::GetCachedFunc:
            {
                // <dst> = GetCachedFunc <scopeObject>, <functionNum>
                // is converted to
                // <dst> = NewScFunc <functionNum>, <env: FrameDisplay>

                if (instr->GetSrc1()->IsScopeObjOpnd(currFunc))
                {
                    instr->m_opcode = Js::OpCode::NewScFunc;
                    IR::Opnd * intConstOpnd = instr->UnlinkSrc2();
                    Assert(intConstOpnd->IsIntConstOpnd());

                    uint nestedFuncIndex = instr->m_func->GetJITFunctionBody()->GetNestedFuncIndexForSlotIdInCachedScope(intConstOpnd->AsIntConstOpnd()->AsUint32());
                    intConstOpnd->Free(instr->m_func);

                    instr->ReplaceSrc1(IR::IntConstOpnd::New(nestedFuncIndex, TyUint32, instr->m_func));
                    instr->SetSrc2(IR::RegOpnd::New(currFunc->GetLocalFrameDisplaySym(), IRType::TyVar, currFunc));
                }
                break;
            }
        }
    }
    return false;
}